

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O3

void dw3_female_soldier(dw_rom *rom)

{
  vpatch(rom,0x87da,2,0xe,0x1b);
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1a8b,3,0x36,0x15,3);
  vpatch(rom,0x12300,0x80,0x26,0x2e,0x76,0x51,0x55,0x5f,0x5f,0x7f,7,0xf,0xf,0xf,0xf,0x1a,0x12,0x38,
         100,0x74,0x6c,0x88,0xa8,0xf8,0xfa,0xf0,0xe0,0xf0,0xf0,0xf0,0xf0,0x58,0x4a,0x1e,0x42,0x69,
         0x18,0x17,8,0xe,0xe,0x1e,0x3f,0x36,0xef,0x78,7,1,0xf,0x1e,0x4e,0x8e,0xe,0xee,0x14,0x70,0x70
         ,0,0xf1,0x7b,0xf5,0x17,0xea,0x94,0xf0,0,0x26);
  vpatch(rom,0x12400,0x180,0,3,0x27,0x28,0x2a,0x2f,0x2f,0x20,3,0xf,0xf,0xf,0xf,4,4,7,0x20,0xe0,0x70,
         0x70,0x50,0x80,0xe0,0xf2,0xc0,0xd0,0x98,0xb8,0xb8,0xf8,0x38,0x7a,0x27,7,7,7,2,1,3,0xf,8,
         0x7d,0x3a,0xb,5,6,7,0xf,0x7e,0x7a,0x5c,0x70,0,0xe0,0xe0,0,0xfe,0xfe,0xfc,0xb0,0xe0,0x30,
         0xe0,0,0);
  return;
}

Assistant:

static void dw3_female_soldier(dw_rom *rom)
{
    vpatch(rom, 0x087da,    2,  0x0e,  0x1b); // his -> her
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x15,  0x03);
    vpatch(rom, 0x12300,  128,  0x26,  0x2e,  0x76,  0x51,  0x55,  0x5f,  0x5f,  0x7f,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1a,  0x12,  0x38,  0x64,  0x74,  0x6c,  0x88,  0xa8,  0xf8,  0xfa,  0xf0,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0x58,  0x4a,  0x1e,  0x42,  0x69,  0x18,  0x17,  0x08,  0x0e,  0x0e,  0x1e,  0x3f,  0x36,  0xef,  0x78,  0x07,  0x01,  0x0f,  0x1e,  0x4e,  0x8e,  0x0e,  0xee,  0x14,  0x70,  0x70,  0x00,  0xf1,  0x7b,  0xf5,  0x17,  0xea,  0x94,  0xf0,  0x00,  0x26,  0x2e,  0x36,  0x31,  0x35,  0x3f,  0x3f,  0x3f,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1a,  0x12,  0x18,  0x64,  0x74,  0x6c,  0x88,  0xa8,  0xf8,  0xfa,  0xfc,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0x58,  0x4a,  0x1f,  0x22,  0x29,  0x08,  0x07,  0x08,  0x0e,  0x0e,  0x00,  0x1f,  0x16,  0x7f,  0x38,  0x07,  0x09,  0x0f,  0x00,  0x43,  0x93,  0x1b,  0xeb,  0x11,  0x70,  0x70,  0x78,  0xfc,  0x6e,  0xfd,  0x1d,  0xe2,  0x81,  0xf0,  0x78);
    vpatch(rom, 0x12400,  384,  0x00,  0x03,  0x27,  0x28,  0x2a,  0x2f,  0x2f,  0x20,  0x03,  0x0f,  0x0f,  0x0f,  0x0f,  0x04,  0x04,  0x07,  0x20,  0xe0,  0x70,  0x70,  0x50,  0x80,  0xe0,  0xf2,  0xc0,  0xd0,  0x98,  0xb8,  0xb8,  0xf8,  0x38,  0x7a,  0x27,  0x07,  0x07,  0x07,  0x02,  0x01,  0x03,  0x0f,  0x08,  0x7d,  0x3a,  0x0b,  0x05,  0x06,  0x07,  0x0f,  0x7e,  0x7a,  0x5c,  0x70,  0x00,  0xe0,  0xe0,  0x00,  0xfe,  0xfe,  0xfc,  0xb0,  0xe0,  0x30,  0xe0,  0x00,  0x00,  0x03,  0x17,  0x18,  0x1a,  0x1f,  0x1f,  0x07,  0x03,  0x0f,  0x0f,  0x0f,  0x0f,  0x04,  0x04,  0x18,  0x20,  0xe0,  0x70,  0x70,  0x50,  0x80,  0xe0,  0xf2,  0xc0,  0xd0,  0x98,  0xb8,  0xb8,  0xf8,  0x38,  0x7a,  0x1a,  0x1a,  0x1b,  0x1b,  0x14,  0x01,  0x09,  0x03,  0x07,  0x2d,  0x14,  0x1c,  0x0b,  0x16,  0x0d,  0x03,  0x7e,  0x7a,  0xdc,  0xf0,  0x00,  0xe0,  0xe0,  0xe0,  0xfe,  0xfe,  0x7c,  0x30,  0xe0,  0x10,  0xe0,  0xe0,  0x04,  0x07,  0x0e,  0x0e,  0x0a,  0x01,  0x07,  0x4f,  0x03,  0x0b,  0x19,  0x1d,  0x1d,  0x1f,  0x1c,  0x5e,  0x00,  0xc0,  0xe4,  0x14,  0x54,  0xf4,  0xf4,  0xe4,  0xc0,  0xf0,  0xf0,  0xf0,  0xf0,  0x20,  0x20,  0x00,  0x7e,  0x5e,  0x3b,  0x0f,  0x00,  0x07,  0x07,  0x00,  0x7f,  0x7f,  0x3e,  0x0c,  0x07,  0x0c,  0x07,  0x00,  0x44,  0x50,  0x90,  0xe0,  0x00,  0x80,  0xc0,  0xf0,  0xe0,  0xae,  0x6c,  0x00,  0xe0,  0x70,  0xe0,  0xf0,  0x04,  0x07,  0x0e,  0x0e,  0x0a,  0x01,  0x07,  0x4f,  0x03,  0x0b,  0x19,  0x1d,  0x1d,  0x1f,  0x1c,  0x5e,  0x00,  0xc0,  0xe8,  0x18,  0x58,  0xf8,  0xf8,  0xe8,  0xc0,  0xf0,  0xf0,  0xf0,  0xf0,  0x20,  0x20,  0x00,  0x7e,  0x5e,  0x3b,  0x0f,  0x00,  0x07,  0x07,  0x07,  0x7f,  0x7f,  0x3e,  0x0c,  0x07,  0x08,  0x07,  0x07,  0x48,  0x40,  0x80,  0xe0,  0x00,  0x80,  0x90,  0xc0,  0xe0,  0xbc,  0x78,  0x00,  0xe0,  0x70,  0xb0,  0xc0,  0x26,  0x2e,  0x36,  0x14,  0x10,  0x00,  0x50,  0x3c,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x5f,  0x7f,  0x64,  0x74,  0x6e,  0x2a,  0x0a,  0x02,  0x0a,  0x3e,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0xfa,  0xfc,  0x77,  0x6f,  0x7d,  0x76,  0x2c,  0x0e,  0x0e,  0x00,  0xbf,  0x9f,  0xbf,  0x9f,  0x53,  0x29,  0x0f,  0x00,  0xee,  0xf2,  0xbc,  0x68,  0x30,  0x70,  0x70,  0x78,  0xfc,  0xf8,  0xff,  0xfe,  0xc6,  0x80,  0xf0,  0x78,  0x26,  0x2e,  0x36,  0x14,  0x10,  0x00,  0x50,  0x3c,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x5f,  0xff,  0x64,  0x74,  0x6c,  0x2c,  0x0c,  0x04,  0x0e,  0x3c,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0xfa,  0xfc,  0xd7,  0xcf,  0xdd,  0xd6,  0x8c,  0x0e,  0x0e,  0x1e,  0x3f,  0x7f,  0xbf,  0xff,  0x43,  0x81,  0x0f,  0x1e,  0xec,  0xf4,  0xbc,  0x68,  0x30,  0x70,  0x70,  0x00,  0xfc,  0xf8,  0xfe,  0xfc,  0xcc,  0x90,  0xf0,  0x00);
}